

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

char * ImGui::GetKeyName(ImGuiKey key)

{
  int iVar1;
  char *pcVar2;
  
  if ((uint)key < 0x200) {
    if (GImGui == (ImGuiContext *)0x0) {
      __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0xe83,"ImGuiIO &ImGui::GetIO()");
    }
    iVar1 = (GImGui->IO).KeyMap[(uint)key];
    if ((iVar1 != -1) && (key = iVar1, 0x84 < iVar1 - 0x200U)) {
      __assert_fail("IsNamedKey((ImGuiKey)io.KeyMap[key])",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                    ,0x1d84,"const char *ImGui::GetKeyName(ImGuiKey)");
    }
    if (iVar1 == -1) {
      return "N/A";
    }
  }
  if (key == 0) {
    pcVar2 = "None";
  }
  else if (key - 0x200U < 0x85) {
    pcVar2 = _ZL9GKeyNames_rel + *(int *)(_ZL9GKeyNames_rel + (ulong)(key - 0x200U) * 4);
  }
  else {
    pcVar2 = "Unknown";
  }
  return pcVar2;
}

Assistant:

const char* ImGui::GetKeyName(ImGuiKey key)
{
#ifdef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((IsNamedKey(key) || key == ImGuiKey_None) && "Support for user key indices was dropped in favor of ImGuiKey. Please update backend and user code.");
#else
    if (IsLegacyKey(key))
    {
        ImGuiIO& io = GetIO();
        if (io.KeyMap[key] == -1)
            return "N/A";
        IM_ASSERT(IsNamedKey((ImGuiKey)io.KeyMap[key]));
        key = (ImGuiKey)io.KeyMap[key];
    }
#endif
    if (key == ImGuiKey_None)
        return "None";
    if (!IsNamedKey(key))
        return "Unknown";

    return GKeyNames[key - ImGuiKey_NamedKey_BEGIN];
}